

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.h
# Opt level: O3

uint8_t * __thiscall
arangodb::velocypack::Builder::addInternal<arangodb::velocypack::Slice>
          (Builder *this,string_view attrName,Slice *sub)

{
  ValueLength *pVVar1;
  pointer pCVar2;
  AttributeTranslator *this_00;
  byte *start;
  ValueLength len;
  uint8_t *puVar3;
  Exception *this_01;
  Slice item;
  ValuePair local_48;
  
  pCVar2 = (this->_stack).
           super__Vector_base<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->_stack).
      super__Vector_base<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
      ._M_impl.super__Vector_impl_data._M_start == pCVar2) {
LAB_0010af63:
    this_00 = this->options->attributeTranslator;
    if ((this_00 != (AttributeTranslator *)0x0) &&
       (start = AttributeTranslator::translate(this_00,attrName), start != (byte *)0x0)) {
      len = (ValueLength)"\x01\x01"[*start];
      local_48._start = start;
      if (len == 0) {
        len = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::byteSizeDynamic
                        ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                         &local_48,start);
      }
      reserve(this,len);
      memcpy(this->_start + this->_pos,start,len);
      this->_pos = this->_pos + len;
      pVVar1 = &this->_bufferPtr->_size;
      *pVVar1 = *pVVar1 + len;
      this->_keyWritten = true;
      puVar3 = set(this,sub);
      return puVar3;
    }
    local_48._type = String;
    local_48._start = (uint8_t *)attrName._M_str;
    local_48._size = attrName._M_len;
    set(this,&local_48);
    this->_keyWritten = true;
    puVar3 = set(this,sub);
    return puVar3;
  }
  if ((this->_start[pCVar2[-1].startPos] == '\v') || (this->_start[pCVar2[-1].startPos] == '\x14'))
  {
    if (this->_keyWritten != true) {
      reportAdd(this);
      goto LAB_0010af63;
    }
    addInternal<arangodb::velocypack::Slice>();
  }
  this_01 = (Exception *)__cxa_allocate_exception(0x18);
  Exception::Exception(this_01,BuilderNeedOpenObject);
  __cxa_throw(this_01,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

uint8_t* addInternal(std::string_view attrName, T const& sub) {
    bool haveReported = false;
    if (!_stack.empty()) {
      ValueLength const to = _stack.back().startPos;
      if (VELOCYPACK_UNLIKELY(_start[to] != 0x0b && _start[to] != 0x14)) {
        throw Exception(Exception::BuilderNeedOpenObject);
      }
      if (VELOCYPACK_UNLIKELY(_keyWritten)) {
        throw Exception(Exception::BuilderKeyAlreadyWritten);
      }
      reportAdd();
      haveReported = true;
    }

    try {
      if (options->attributeTranslator != nullptr) {
        // check if a translation for the attribute name exists
        uint8_t const* translated =
            options->attributeTranslator->translate(attrName);

        if (translated != nullptr) {
          Slice item(translated);
          ValueLength const l = item.byteSize();
          reserve(l);
          memcpy(_start + _pos, translated, checkOverflow(l));
          advance(l);
          return writeValue(sub);
        }
        // otherwise fall through to regular behavior
      }

      set(ValuePair(attrName.data(), attrName.size(), ValueType::String));
      return writeValue(sub);
    } catch (...) {
      // clean up in case of an exception
      if (haveReported) {
        cleanupAdd();
      }
      throw;
    }
  }